

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipmerge.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  long lVar7;
  undefined8 uVar8;
  int *piVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  FILE *pFVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int err;
  int err_1;
  void *local_4d8;
  char **local_4d0;
  ulong local_4c8;
  long local_4c0;
  undefined1 local_4b8 [24];
  zip_uint64_t local_4a0;
  zip_uint32_t local_488;
  zip_stat st;
  zip_error_t error;
  
  progname = *argv;
  confirm = 1;
  name_flags = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar1 = getopt(argc,argv,"hVDiIsS"), iVar1 == 0x44) {
            name_flags = name_flags | 2;
          }
          if (iVar1 != 0x49) break;
          name_flags = name_flags | 1;
        }
        if (iVar1 != 0x53) break;
        confirm = confirm & 0xffffffcfU | 0x20;
      }
      if (iVar1 != 0x69) break;
      confirm = confirm & 0xfffffffe;
    }
    if (iVar1 != 0x73) break;
    confirm = confirm & 0xffffffcfU | 0x10;
  }
  if (iVar1 != -1) {
    if (iVar1 == 0x56) {
      pcVar10 = version_string;
    }
    else {
      if (iVar1 != 0x68) goto LAB_001017e8;
      fputs(help_head,_stdout);
      printf("usage: %s [-DhIiSsV] target-zip zip...\n",progname);
      pcVar10 = help;
    }
    fputs(pcVar10,_stdout);
LAB_00101824:
    exit(0);
  }
  lVar17 = (long)_optind;
  if (_optind + 2 <= argc) {
    _optind = _optind + 1;
    pcVar10 = argv[lVar17];
    uVar16 = (ulong)(uint)(argc - _optind);
    local_4d8 = malloc(uVar16 * 8);
    if (local_4d8 == (void *)0x0) {
      fprintf(_stderr,"%s: out of memory\n",progname);
    }
    else {
      lVar2 = zip_open(pcVar10,1,&err);
      if (lVar2 == 0) {
        zip_error_init_with_code(&error,err);
        pFVar14 = _stderr;
        pcVar11 = progname;
        uVar3 = zip_error_strerror(&error);
LAB_00101759:
        fprintf(pFVar14,"%s: can\'t open zip archive \'%s\': %s\n",pcVar11,pcVar10,uVar3);
        zip_error_fini(&error);
      }
      else {
        local_4d0 = argv + lVar17 + 1;
        uVar12 = 0;
        while (uVar12 != uVar16) {
          pcVar13 = local_4d0[uVar12];
          lVar17 = zip_open(pcVar13,0,&err_1);
          if (lVar17 == 0) {
            zip_error_init_with_code(&error,err_1);
            pFVar14 = _stderr;
            pcVar11 = progname;
            uVar3 = zip_error_strerror(&error);
            pcVar10 = pcVar13;
            goto LAB_00101759;
          }
          local_4c0 = zip_get_num_entries(lVar17);
          pFVar14 = _stderr;
          pcVar11 = progname;
          if (local_4c0 < 0) {
            uVar3 = zip_strerror(lVar2);
            pcVar5 = "%s: cannot get number of entries for \'%s\': %s\n";
            pcVar10 = pcVar13;
            goto LAB_00101798;
          }
          local_4c8 = uVar12;
          for (lVar15 = 0; local_4c0 != lVar15; lVar15 = lVar15 + 1) {
            uVar3 = zip_get_name(lVar17,lVar15,0);
            lVar4 = zip_name_locate(lVar2,uVar3,name_flags);
            if (lVar4 < 0) {
              lVar4 = zip_source_zip(lVar2,lVar17,lVar15,0,0,0);
              if ((lVar4 == 0) || (lVar7 = zip_add(lVar2,uVar3,lVar4), lVar7 < 0)) {
                zip_source_free(lVar4);
                pFVar14 = _stderr;
                pcVar11 = progname;
                uVar8 = zip_strerror(lVar2);
                pcVar13 = "%s: cannot add \'%s\' to `%s\': %s\n";
LAB_0010164c:
                fprintf(pFVar14,pcVar13,pcVar11,uVar3,pcVar10,uVar8);
LAB_0010170d:
                zip_close(lVar17);
                goto LAB_00101712;
              }
            }
            else if ((confirm & 1U) == 0) {
              if ((confirm & 2U) == 0) {
                iVar1 = zip_stat_index(lVar2,lVar4,8,&st);
                pFVar14 = _stderr;
                pcVar11 = progname;
                if (iVar1 < 0) {
                  uVar3 = zip_strerror(lVar2);
                }
                else {
                  iVar1 = zip_stat_index(lVar17,lVar15,0,local_4b8);
                  pFVar14 = _stderr;
                  pcVar11 = progname;
                  if (-1 < iVar1) {
                    if (st.crc == local_488 && st.size == local_4a0) {
                      if ((confirm & 0x10U) != 0) goto LAB_00101572;
                      if ((confirm & 0x20U) != 0) goto LAB_001015d7;
                    }
                    printf("replace \'%s\' (%lu / %08x) in `%s\'\n   with \'%s\' (%lu / %08x) from `%s\'? "
                           ,st.name);
                    fflush(_stdout);
                    pcVar5 = fgets((char *)&error,0x400,_stdin);
                    pFVar14 = _stderr;
                    pcVar11 = progname;
                    if (pcVar5 != (char *)0x0) {
                      pp_Var6 = __ctype_tolower_loc();
                      if ((*pp_Var6)[(byte)error.zip_err] == 0x79) goto LAB_00101572;
                      goto LAB_001015d7;
                    }
                    piVar9 = __errno_location();
                    pcVar10 = strerror(*piVar9);
                    fprintf(pFVar14,"%s: read error from stdin: %s\n",pcVar11,pcVar10);
                    goto LAB_0010170d;
                  }
                  uVar3 = zip_strerror(lVar17);
                  lVar4 = lVar15;
                  pcVar10 = pcVar13;
                }
                fprintf(pFVar14,"%s: cannot stat file %lu in \'%s\': %s\n",pcVar11,lVar4,pcVar10,
                        uVar3);
                goto LAB_0010170d;
              }
            }
            else {
LAB_00101572:
              lVar7 = zip_source_zip(lVar2,lVar17,lVar15,0,0,0);
              if ((lVar7 == 0) || (iVar1 = zip_replace(lVar2,lVar4,lVar7), iVar1 < 0)) {
                zip_source_free(lVar7);
                pFVar14 = _stderr;
                pcVar11 = progname;
                uVar8 = zip_strerror(lVar2);
                pcVar13 = "%s: cannot replace \'%s\' in `%s\': %s\n";
                goto LAB_0010164c;
              }
            }
LAB_001015d7:
          }
          *(long *)((long)local_4d8 + local_4c8 * 8) = lVar17;
          uVar12 = local_4c8 + 1;
        }
        iVar1 = zip_close();
        pFVar14 = _stderr;
        pcVar11 = progname;
        if (-1 < iVar1) {
          for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
            zip_close();
          }
          goto LAB_00101824;
        }
        uVar3 = zip_strerror(lVar2);
        pcVar5 = "%s: cannot write zip archive \'%s\': %s\n";
LAB_00101798:
        fprintf(pFVar14,pcVar5,pcVar11,pcVar10,uVar3);
      }
    }
LAB_00101712:
    iVar1 = 1;
    goto LAB_00101714;
  }
LAB_001017e8:
  fprintf(_stderr,"usage: %s [-DhIiSsV] target-zip zip...\n",progname);
  iVar1 = 2;
LAB_00101714:
  exit(iVar1);
}

Assistant:

int
main(int argc, char *argv[]) {
    zip_t *za;
    zip_t **zs;
    int c, err;
    unsigned int i, n;
    char *tname;

    progname = argv[0];

    confirm = CONFIRM_ALL_YES;
    name_flags = 0;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'D':
	    name_flags |= ZIP_FL_NODIR;
	    break;
	case 'i':
	    confirm &= ~CONFIRM_ALL_YES;
	    break;
	case 'I':
	    name_flags |= ZIP_FL_NOCASE;
	    break;
	case 's':
	    confirm &= ~CONFIRM_SAME_NO;
	    confirm |= CONFIRM_SAME_YES;
	    break;
	case 'S':
	    confirm &= ~CONFIRM_SAME_YES;
	    confirm |= CONFIRM_SAME_NO;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc < optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    tname = argv[optind++];
    argv += optind;

    n = (unsigned int)(argc - optind);
    if ((zs = (zip_t **)malloc(sizeof(zs[0]) * n)) == NULL) {
	fprintf(stderr, "%s: out of memory\n", progname);
	exit(1);
    }

    if ((za = zip_open(tname, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", progname, tname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    for (i = 0; i < n; i++) {
	if ((zs[i] = merge_zip(za, tname, argv[i])) == NULL)
	    exit(1);
    }

    if (zip_close(za) < 0) {
	fprintf(stderr, "%s: cannot write zip archive '%s': %s\n", progname, tname, zip_strerror(za));
	exit(1);
    }

    for (i = 0; i < n; i++)
	zip_close(zs[i]);

    exit(0);
}